

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O1

void __thiscall
dlib::
array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
::push_back(array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,member_function_pointer<void,_void,_void,_void> *item)

{
  bool bVar1;
  unsigned_long uVar2;
  member_function_pointer<void,_void,_void,_void> *item_00;
  unsigned_long uVar3;
  member_function_pointer<void,_void,_void,_void> *pmVar4;
  member_function_pointer<void,_void,_void,_void> *pmVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  unsigned_long i;
  ulong uVar7;
  long lVar8;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_70;
  
  uVar2 = this->max_array_size;
  iVar6 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])();
  if (uVar2 == CONCAT44(extraout_var,iVar6)) {
    local_70.super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>.
    _vptr_enumerable = (_func_int **)&PTR__array_00322890;
    local_70.pool._vptr_memory_manager_stateless_kernel_1 =
         (_func_int **)&PTR__memory_manager_stateless_kernel_1_003229a0;
    local_70.array_size = 0;
    local_70.max_array_size = 0;
    local_70.array_elements = (member_function_pointer<void,_void,_void,_void> *)0x0;
    local_70.pos = (member_function_pointer<void,_void,_void,_void> *)0x0;
    local_70.last_pos = (member_function_pointer<void,_void,_void,_void> *)0x0;
    local_70._at_start = true;
    iVar6 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
              _vptr_enumerable[8])(this);
    set_max_size(&local_70,CONCAT44(extraout_var_00,iVar6) * 2 + 1);
    iVar6 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
              _vptr_enumerable[8])(this);
    set_size(&local_70,CONCAT44(extraout_var_01,iVar6) + 1);
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      iVar6 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
                _vptr_enumerable[8])(this);
      if (CONCAT44(extraout_var_02,iVar6) <= uVar7) break;
      exchange<dlib::member_function_pointer<void,void,void,void>>
                ((member_function_pointer<void,_void,_void,_void> *)
                 ((long)&(this->array_elements->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem +
                 lVar8),(member_function_pointer<void,_void,_void,_void> *)
                        ((long)&((local_70.array_elements)->super_mfp_kernel_1_base_class<0UL>).
                                mp_memory.mem + lVar8));
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x40;
    }
    exchange<dlib::member_function_pointer<void,void,void,void>>
              (item,local_70.array_elements + (local_70.array_size - 1));
    item_00 = this->array_elements;
    uVar2 = this->array_size;
    uVar3 = this->max_array_size;
    this->array_size = local_70.array_size;
    this->max_array_size = local_70.max_array_size;
    bVar1 = this->_at_start;
    this->_at_start = local_70._at_start;
    pmVar4 = this->pos;
    pmVar5 = this->last_pos;
    this->array_elements = local_70.array_elements;
    this->pos = local_70.pos;
    this->last_pos = local_70.last_pos;
    local_70.super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>.
    _vptr_enumerable = (_func_int **)&PTR__array_00322890;
    if (item_00 != (member_function_pointer<void,_void,_void,_void> *)0x0) {
      local_70.array_size = uVar2;
      local_70.max_array_size = uVar3;
      local_70.array_elements = item_00;
      local_70.pos = pmVar4;
      local_70.last_pos = pmVar5;
      local_70._at_start = bVar1;
      memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>::
      deallocate_array(&local_70.pool,item_00);
    }
    return;
  }
  iVar6 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])(this);
  set_size(this,CONCAT44(extraout_var_03,iVar6) + 1);
  iVar6 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])(this);
  exchange<dlib::member_function_pointer<void,void,void,void>>
            (item,this->array_elements + CONCAT44(extraout_var_04,iVar6) + -1);
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (unsigned long i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }